

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::
protobuf::io::Printer*)::LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
          (void *this,FieldDescriptor *field)

{
  long lVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  OneofDescriptor *pOVar5;
  OneofDescriptor *pOVar6;
  char *pcVar7;
  int __c;
  FieldDescriptor *__s;
  allocator<char> local_10d;
  int new_index;
  FieldDescriptor *field_local;
  string local_100;
  Sub local_e0;
  
  __s = field;
  field_local = field;
  cVar3 = google::protobuf::FieldDescriptor::has_presence();
  if (cVar3 != '\0') {
    if (*(undefined8 **)((long)this + 0x10) == *(undefined8 **)((long)this + 0x18))
    goto LAB_001db863;
    pOVar5 = FieldDescriptor::containing_oneof
                       ((FieldDescriptor *)**(undefined8 **)((long)this + 0x10));
    pOVar6 = FieldDescriptor::containing_oneof(field);
    if (pOVar5 == pOVar6) goto LAB_001db863;
  }
  GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::Flush((LazySerializerEmitter *)this);
LAB_001db863:
  pOVar5 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar5 == (OneofDescriptor *)0x0) {
    cVar3 = google::protobuf::internal::cpp::HasHasbit(field);
    if (cVar3 != '\0') {
      cVar3 = google::protobuf::FieldDescriptor::has_presence();
      if (cVar3 != '\0') {
        lVar1 = *this;
        pcVar7 = FieldDescriptor::index(field,(char *)__s,__c);
        iVar4 = *(int *)(*(long *)(lVar1 + 0x118) + (long)(int)pcVar7 * 4) / 0x20;
        if (*(int *)((long)this + 0x28) != iVar4) {
          uVar2 = *(undefined8 *)((long)this + 8);
          new_index = iVar4;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,"index",&local_10d);
          protobuf::io::Printer::Sub::Sub<int&>(&local_e0,&local_100,&new_index);
          google::protobuf::io::Printer::Emit
                    (uVar2,&local_e0,1,0x61,
                     "\n                       cached_has_bits = this_._impl_._has_bits_[$index$];\n                     "
                    );
          protobuf::io::Printer::Sub::~Sub(&local_e0);
          std::__cxx11::string::~string((string *)&local_100);
          *(int *)((long)this + 0x28) = new_index;
        }
      }
    }
    GenerateSerializeOneField(*this,*(Printer **)((long)this + 8),field,*(int *)((long)this + 0x28))
    ;
  }
  else {
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)((long)this + 0x10),&field_local);
  }
  return;
}

Assistant:

void Emit(const FieldDescriptor* field) {
      if (!field->has_presence() || MustFlush(field)) {
        Flush();
      }
      if (field->real_containing_oneof()) {
        v_.push_back(field);
      } else {
        // TODO: Defer non-oneof fields similarly to oneof fields.
        if (HasHasbit(field) && field->has_presence()) {
          // We speculatively load the entire _has_bits_[index] contents, even
          // if it is for only one field.  Deferring non-oneof emitting would
          // allow us to determine whether this is going to be useful.
          int has_bit_index = mg_->has_bit_indices_[field->index()];
          if (cached_has_bit_index_ != has_bit_index / 32) {
            // Reload.
            int new_index = has_bit_index / 32;
            p_->Emit({{"index", new_index}},
                     R"cc(
                       cached_has_bits = this_._impl_._has_bits_[$index$];
                     )cc");
            cached_has_bit_index_ = new_index;
          }
        }

        mg_->GenerateSerializeOneField(p_, field, cached_has_bit_index_);
      }
    }